

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.h
# Opt level: O0

void __thiscall
ZXing::Pdf417::BarcodeRow::getScaledRow
          (BarcodeRow *this,int scale,vector<bool,_std::allocator<bool>_> *output)

{
  const_reference __x;
  size_type sVar1;
  size_type in_RDX;
  undefined4 in_ESI;
  size_t i;
  undefined4 in_stack_00000048;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference in_stack_ffffffffffffffd0;
  ulong local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  std::vector<bool,_std::allocator<bool>_>::size
            ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->_row,CONCAT44(scale,in_stack_00000048),output._7_1_);
  local_20 = 0;
  while( true ) {
    this_00 = (vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffd0._M_p;
    sVar1 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    if (sVar1 <= local_20) break;
    __x = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDX);
    in_stack_ffffffffffffffd0 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDX)
    ;
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd0,__x);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void getScaledRow(int scale, std::vector<bool>& output) const {
		output.resize(_row.size() * scale);
		for (size_t i = 0; i < output.size(); ++i) {
			output[i] = _row[i / scale];
		}
	}